

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

int testInvalid_Classifier_PredictedFeatureNameWrongType(void)

{
  Rep *pRVar1;
  string *psVar2;
  FeatureType *pFVar3;
  bool bVar4;
  ModelDescription *pMVar5;
  Type *pTVar6;
  FeatureType *pFVar7;
  Int64FeatureType *this;
  ostream *poVar8;
  StringFeatureType *this_00;
  int iVar9;
  long lVar10;
  long lVar11;
  long *plVar12;
  void **ppvVar13;
  Model spec;
  Result res;
  FeatureDescription feature;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classLabels;
  TensorAttributes tensorAttributesIn;
  string labels [4];
  Model local_1a0;
  _func_int **local_170;
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  vector<long,_std::allocator<long>_> local_148;
  undefined1 local_128 [8];
  _Alloc_hider local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  TensorAttributes local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  CoreML::Specification::Model::Model(&local_1a0);
  CoreML::Result::Result((Result *)&local_170);
  local_c8.name._0_4_ = 0x3278c5;
  local_c8.name._4_4_ = 0;
  local_c8.dimension = 3;
  local_c8._12_4_ = 0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"1","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"2","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"3","");
  plVar12 = local_48;
  local_58[0] = plVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"4","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__cxx11::string*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
             &local_b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_48 + 2),
             (allocator_type *)local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f8,&local_e0);
  local_148.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_148.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_148.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  buildBasicNeuralNetworkClassifierModel(&local_1a0,true,&local_c8,&local_f8,&local_148,true);
  if (local_148.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  local_1a0.specificationversion_ = 4;
  if (local_1a0.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_1a0.description_ = pMVar5;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&((local_1a0.description_)->traininginput_).super_RepeatedPtrFieldBase);
  pMVar5 = local_1a0.description_;
  if (local_1a0.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  pRVar1 = (pMVar5->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar13 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar13 = (void **)0x0;
  }
  lVar11 = (long)(pMVar5->input_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar11 != 0) {
    lVar10 = 0;
    do {
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)local_128,*(FeatureDescription **)((long)ppvVar13 + lVar10));
      if (local_1a0.description_ == (ModelDescription *)0x0) {
        pMVar5 = (ModelDescription *)operator_new(0x78);
        CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
        local_1a0.description_ = pMVar5;
      }
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&((local_1a0.description_)->traininginput_).super_RepeatedPtrFieldBase,
                          (Type *)0x0);
      CoreML::Specification::FeatureDescription::CopyFrom(pTVar6,(FeatureDescription *)local_128);
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)local_128);
      lVar10 = lVar10 + 8;
    } while (lVar11 * 8 != lVar10);
  }
  if (local_1a0.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_1a0.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_1a0.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  pMVar5 = local_1a0.description_;
  if (local_1a0.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  psVar2 = (pTVar6->name_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&pTVar6->name_,(pMVar5->predictedfeaturename_).ptr_);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7 == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 1) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 1;
    this = (Int64FeatureType *)operator_new(0x18);
    CoreML::Specification::Int64FeatureType::Int64FeatureType(this);
    (pFVar7->Type_).int64type_ = this;
  }
  CoreML::Model::validate((Result *)local_128,&local_1a0);
  local_170 = (_func_int **)local_128;
  std::__cxx11::string::operator=((string *)&local_168,(string *)&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_p != &local_110) {
    operator_delete(local_120._M_p,(ulong)(local_110._M_allocated_capacity + 1));
  }
  bVar4 = CoreML::Result::good((Result *)&local_170);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x93a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  }
  else {
    pFVar7 = pTVar6->type_;
    if (pFVar7 == (FeatureType *)0x0) {
      pFVar7 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar7);
      pTVar6->type_ = pFVar7;
    }
    if (pFVar7->_oneof_case_[0] == 1) {
      if ((pFVar7->Type_).int64type_ == (Int64FeatureType *)0x0) {
        pFVar7->_oneof_case_[0] = 0;
      }
      else {
        (*(((pFVar7->Type_).int64type_)->super_MessageLite)._vptr_MessageLite[1])();
        pFVar3 = pTVar6->type_;
        pFVar7->_oneof_case_[0] = 0;
        pFVar7 = pFVar3;
        if (pFVar3 == (FeatureType *)0x0) {
          pFVar7 = (FeatureType *)operator_new(0x28);
          CoreML::Specification::FeatureType::FeatureType(pFVar7);
          pTVar6->type_ = pFVar7;
        }
      }
    }
    if (pFVar7->_oneof_case_[0] != 3) {
      CoreML::Specification::FeatureType::clear_Type(pFVar7);
      pFVar7->_oneof_case_[0] = 3;
      this_00 = (StringFeatureType *)operator_new(0x18);
      CoreML::Specification::StringFeatureType::StringFeatureType(this_00);
      (pFVar7->Type_).stringtype_ = this_00;
    }
    CoreML::Model::validate((Result *)local_128,&local_1a0);
    local_170 = (_func_int **)local_128;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_p != &local_110) {
      operator_delete(local_120._M_p,(ulong)(local_110._M_allocated_capacity + 1));
    }
    bVar4 = CoreML::Result::good((Result *)&local_170);
    iVar9 = 0;
    if (bVar4) goto LAB_001b59c8;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x941);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  }
  std::ostream::put((char)poVar8);
  iVar9 = 1;
  std::ostream::flush();
LAB_001b59c8:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0);
  lVar11 = -0x80;
  do {
    if (plVar12 != (long *)plVar12[-2]) {
      operator_delete((long *)plVar12[-2],*plVar12 + 1);
    }
    plVar12 = plVar12 + -4;
    lVar11 = lVar11 + 0x20;
  } while (lVar11 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p != &local_158) {
    operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_1a0);
  return iVar9;
}

Assistant:

int testInvalid_Classifier_PredictedFeatureNameWrongType() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };

    std::string labels[] = { "1", "2", "3", "4" };
    std::vector<std::string> classLabels(labels, labels + sizeof(labels) / sizeof(std::string));

    (void)buildBasicNeuralNetworkClassifierModel(spec, true, &tensorAttributesIn, classLabels, std::vector<int64_t>(), true);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    // Clearing and then specifically adding only the predicted feature name as a training input (for the classifier)
    spec.mutable_description()->clear_traininginput();

    // Re-adding model inputs and the target + predicted feature nmae to classifier's training inputs
    for (auto feature : spec.description().input()) {
        auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInput->CopyFrom(feature);
    }

    auto trainingInput2 = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput2->set_name(spec.description().predictedfeaturename());
    trainingInput2->mutable_type()->mutable_int64type(); // buildBasicNeuralNetworkClassifierModel adds the predictedFeatureName's output as a String type, this should fail validation

    res = Model::validate(spec);
    ML_ASSERT_BAD(res);


    // Correct type of target in training inputs
    trainingInput2->mutable_type()->clear_int64type();
    trainingInput2->mutable_type()->mutable_stringtype();
    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);
    return 0;
}